

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::DebugOutStreambuf::flushLine(DebugOutStreambuf *this)

{
  char *message;
  allocator<char> local_61;
  string local_60 [48];
  string local_30 [32];
  DebugOutStreambuf *local_10;
  DebugOutStreambuf *this_local;
  
  local_10 = this;
  std::__cxx11::ostringstream::str();
  message = (char *)std::__cxx11::string::c_str();
  qpPrint(message);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_61);
  std::__cxx11::ostringstream::str((string *)&this->m_curLine);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void DebugOutStreambuf::flushLine (void)
{
	qpPrint(m_curLine.str().c_str());
	m_curLine.str("");
}